

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_bundle.cpp
# Opt level: O0

void * fe_load_effect(fe_state *s,fe_effect *effect)

{
  int iVar1;
  int id;
  int pin;
  fe_node **ppfVar2;
  fe_node *pfVar3;
  float fVar4;
  int dp;
  int dn;
  int sn;
  fe_node *destLast;
  fe_node *srcLast;
  int i_2;
  fe_node *node;
  int i_1;
  int i;
  char *p;
  int num;
  int len;
  char *param;
  fe_effect *effect_local;
  fe_state *s_local;
  
  effect->text[0] = '\0';
  effect->path_back[0] = '\0';
  effect->path_font[0] = '\0';
  effect->distance = 1.0;
  effect->px = -999;
  effect->py = -999;
  read_fixed(s,"#");
  if ((s->error & 1U) != 0) {
    error();
  }
  read_token(s);
  if ((s->error & 1U) != 0) {
    error();
  }
  safe_strcpy<32ul>(effect->id,s->token);
  read_fixed(s,"size:");
  if ((s->error & 1U) != 0) {
    error();
  }
  iVar1 = read_int(s);
  effect->size = iVar1;
  if ((s->error & 1U) != 0) {
    error();
  }
  while (*s->data != '@') {
    read_token(s);
    if ((s->error & 1U) != 0) {
      error();
    }
    iVar1 = strcmp(s->token,"distance");
    if (iVar1 == 0) {
      fVar4 = read_float(s);
      effect->distance = fVar4;
      if ((s->error & 1U) != 0) {
        error();
      }
    }
    else {
      iVar1 = strcmp(s->token,"pos");
      if (iVar1 == 0) {
        iVar1 = read_int(s);
        effect->px = (short)iVar1;
        if ((s->error & 1U) != 0) {
          error();
        }
        iVar1 = read_int(s);
        effect->py = (short)iVar1;
        if ((s->error & 1U) != 0) {
          error();
        }
      }
      else {
        _num = (char *)0x0;
        p._4_4_ = 0;
        iVar1 = strcmp(s->token,"font");
        if (iVar1 == 0) {
          p._4_4_ = 0x100;
          _num = effect->path_font;
        }
        iVar1 = strcmp(s->token,"back");
        if (iVar1 == 0) {
          p._4_4_ = 0x100;
          _num = effect->path_back;
        }
        iVar1 = strcmp(s->token,"text");
        if (iVar1 == 0) {
          p._4_4_ = 0x20;
          _num = effect->text;
        }
        read_token_end_line(s);
        if ((s->error & 1U) != 0) {
          error();
        }
        safe_strcpy(_num,p._4_4_,s->token);
      }
    }
  }
  read_fixed(s,"@nodes");
  if ((s->error & 1U) != 0) {
    error();
  }
  next_line(s);
  if ((s->error & 1U) != 0) {
    error();
  }
  p._0_4_ = 0;
  _i_1 = s->data;
  for (node._4_4_ = 0; node._4_4_ < s->size; node._4_4_ = node._4_4_ + 1) {
    if (*_i_1 == '*') {
      p._0_4_ = (int)p + 1;
    }
    if (*_i_1 == '@') break;
    _i_1 = _i_1 + 1;
  }
  effect->num = (int)p;
  ppfVar2 = (fe_node **)_fe_alloc((long)(int)p << 3);
  effect->nodes = ppfVar2;
  for (node._0_4_ = 0; (int)node < (int)p; node._0_4_ = (int)node + 1) {
    pfVar3 = fe_load_node(s);
    pfVar3->effect = effect;
    pfVar3->index = (int)node;
    effect->nodes[(int)node] = pfVar3;
    if ((s->error & 1U) != 0) {
      error();
    }
    if (pfVar3->type == 0x32) {
      effect->out_node = pfVar3;
    }
  }
  read_fixed(s,"@edges");
  if ((s->error & 1U) != 0) {
    error();
  }
  next_line(s);
  if ((s->error & 1U) != 0) {
    error();
  }
  _i_1 = s->data;
  srcLast._4_4_ = 0;
  for (; (srcLast._4_4_ < s->size && (*_i_1 != '#')); _i_1 = _i_1 + 1) {
    srcLast._4_4_ = srcLast._4_4_ + 1;
  }
  destLast = *effect->nodes;
  _dn = *effect->nodes;
  while (*s->data == '*') {
    s->data = s->data + 1;
    s->size = s->size + -1;
    read_token(s);
    if ((s->error & 1U) != 0) {
      error();
    }
    iVar1 = atoi(s->token);
    read_token(s);
    if ((s->error & 1U) != 0) {
      error();
    }
    id = atoi(s->token);
    read_token(s);
    if ((s->error & 1U) != 0) {
      error();
    }
    pin = atoi(s->token);
    if (destLast->id != iVar1) {
      destLast = fe_effect_find_node(effect,iVar1);
    }
    if (_dn->id != id) {
      _dn = fe_effect_find_node(effect,id);
    }
    _fe_node_connect(destLast,_dn,pin);
  }
  return (void *)0x0;
}

Assistant:

void* fe_load_effect(fe_state& s, fe_effect* effect)
{
    effect->text[0] = 0;
    effect->path_back[0] = 0;
    effect->path_font[0] = 0;
    effect->distance = 1.0f;
	effect->px = -999;
	effect->py = -999;

    read_fixed(s, "#");
    CHECK_ERR();

    read_token(s);
    CHECK_ERR();
    safe_strcpy(effect->id, s.token);

    read_fixed(s, "size:");
    CHECK_ERR();

    effect->size = READ_INT(s);


    while (s.data[0] != '@')
    {
        read_token(s);
        CHECK_ERR();

        if (!strcmp(s.token, "distance"))
        {
            effect->distance = READ_FLOAT(s);
            continue;
        }


		if (!strcmp(s.token, "pos"))
		{
			effect->px = READ_INT(s);
			effect->py = READ_INT(s);
			continue;
		}

        char *param = 0;
        int len = 0;
        if (!strcmp(s.token, "font"))
        {
            len = sizeof(effect->path_font);
            param = effect->path_font;
        }
        if (!strcmp(s.token, "back"))
        {
            len = sizeof(effect->path_back);
            param = effect->path_back;
        }
        if (!strcmp(s.token, "text"))
        {
            len = sizeof(effect->text);
            param = effect->text;
        }

        

        read_token_end_line(s);
        CHECK_ERR();
        safe_strcpy(param, len, s.token);
    }
    
    read_fixed(s, "@nodes");
    CHECK_ERR();

    next_line(s);
    CHECK_ERR();

    int num = 0;
    const char* p = s.data;
    for (int i = 0; i < s.size; ++i)
    {
        if (*p == '*')
            num++;
        if (*p == '@')
            break;
        ++p;
    }

    effect->num = num;
    effect->nodes = (fe_node**)_fe_alloc(sizeof(fe_node*) * num);

    for (int i = 0; i < num; ++i)
    {
        fe_node *node = fe_load_node(s);
        node->effect = effect;
        node->index = i;

        effect->nodes[i] = node;
        CHECK_ERR();      


        if (node->type == fe_node_type_out)
            effect->out_node = node;
    }

    read_fixed(s, "@edges");
    CHECK_ERR();

    next_line(s);
    CHECK_ERR();


    num = 0;
    p = s.data;
    for (int i = 0; i < s.size; ++i)
    {
        if (*p == '*')
            num++;
        if (*p == '#')
            break;
        ++p;
    }


    fe_node* srcLast = effect->nodes[0];
    fe_node* destLast = effect->nodes[0];
    while (*s.data == '*')
    {
        s.data++;
        s.size--;

        read_token(s);
        CHECK_ERR();

        int sn = atoi(s.token);

        read_token(s);
        CHECK_ERR();

        int dn = atoi(s.token);

        read_token(s);
        CHECK_ERR();

        int dp = atoi(s.token);

        if (srcLast->id != sn)
            srcLast = fe_effect_find_node(effect, sn);

        if (destLast->id != dn)
            destLast = fe_effect_find_node(effect, dn);

        _fe_node_connect(srcLast, destLast, dp);
    }



    return 0;
}